

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadjointcheckpointscheme_fixed.c
# Opt level: O2

SUNErrCode
SUNAdjointCheckpointScheme_LoadVector_Fixed
          (SUNAdjointCheckpointScheme self,suncountertype step_num,suncountertype stage_num,int peek
          ,N_Vector *yout,sunrealtype *tout)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  SUNDataNode step_data_node;
  SUNDataNode solution_node;
  int has_children;
  long local_58;
  long local_50;
  int local_44;
  suncountertype local_40;
  N_Vector *local_38;
  
  local_58 = 0;
  local_38 = yout;
  if (*(long *)((long)self->content + 0x18) == step_num) {
    local_58 = *(long *)((long)self->content + 0x38);
  }
  else {
    local_40 = stage_num;
    pcVar3 = sunSignedToString(step_num);
    iVar2 = SUNDataNode_GetNamedChild(*(undefined8 *)((long)self->content + 0x28),pcVar3,&local_58);
    free(pcVar3);
    if (iVar2 == -0x26ff) {
      return -0x26f7;
    }
    stage_num = local_40;
    if (iVar2 == 0) {
      pvVar1 = self->content;
      *(long *)((long)pvVar1 + 0x38) = local_58;
      *(suncountertype *)((long)pvVar1 + 0x18) = step_num;
    }
  }
  if (local_58 != 0) {
    local_50 = 0;
    if (*(int *)((long)self->content + 0x44) == 0 && peek == 0) {
      local_44 = 0;
      SUNDataNode_HasChildren(local_58,&local_44);
      if ((local_44 != 0) &&
         (iVar2 = SUNDataNode_RemoveChild(local_58,stage_num,&local_50), iVar2 == -0x26ff)) {
        local_50 = 0;
      }
      SUNDataNode_HasChildren(local_58,&local_44);
      if (local_44 == 0) {
        pcVar3 = sunSignedToString(step_num);
        SUNDataNode_RemoveNamedChild(*(undefined8 *)((long)self->content + 0x28),pcVar3,&local_58);
        free(pcVar3);
        SUNDataNode_Destroy(&local_58);
      }
    }
    else {
      iVar2 = SUNDataNode_GetChild(local_58,stage_num,&local_50);
      if (iVar2 == -0x26ff) {
        return -0x26f7;
      }
    }
    if (local_50 != 0) {
      SUNDataNode_GetDataNvector(local_50,*local_38,tout);
      if (peek == 0 && *(int *)((long)self->content + 0x44) == 0) {
        SUNDataNode_Destroy(&local_50);
        return 0;
      }
      return 0;
    }
  }
  return -0x26f7;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_LoadVector_Fixed(
  SUNAdjointCheckpointScheme self, suncountertype step_num,
  suncountertype stage_num, sunbooleantype peek, N_Vector* yout,
  sunrealtype* tout)
{
  SUNFunctionBegin(self->sunctx);

  SUNErrCode errcode = SUN_SUCCESS;

  /* If we are trying to load the step solution, we need to load the list which holds
     the step and stage solutions. We keep a pointer to the list node until
     this step is over for fast access when loading stages. */
  SUNDataNode step_data_node = NULL;
  if (step_num != IMPL_MEMBER(self, step_num_of_current_load))
  {
    char* key = sunSignedToString(step_num);
    SUNLogExtraDebug(SUNCTX_->logger, "try-load-new-step",
                     "step_num = %d, stage_num = %d", step_num, stage_num);
    errcode = SUNDataNode_GetNamedChild(IMPL_MEMBER(self, root_node), key,
                                        &step_data_node);
    free(key);
    if (errcode == SUN_SUCCESS)
    {
      IMPL_MEMBER(self, current_load_step_node)   = step_data_node;
      IMPL_MEMBER(self, step_num_of_current_load) = step_num;
    }
    else if (errcode == SUN_ERR_DATANODE_NODENOTFOUND)
    {
      step_data_node = NULL;
    }
    else { SUNCheckCall(errcode); }
  }
  else { step_data_node = IMPL_MEMBER(self, current_load_step_node); }

  if (!step_data_node)
  {
    SUNLogExtraDebug(SUNCTX_->logger, "step-not-found",
                     "step_num = %d, stage_num = %d", step_num, stage_num);
    return SUN_ERR_CHECKPOINT_NOT_FOUND;
  }

  SUNLogExtraDebug(SUNCTX_->logger, "step-loaded",
                   "step_num = %d, stage_num = %d", step_num, stage_num);

  SUNDataNode solution_node = NULL;
  if (IMPL_MEMBER(self, keep) || peek)
  {
    SUNLogExtraDebug(SUNCTX_->logger, "try-load-stage",
                     "keep = 1, step_num = %d, stage_num = %d", step_num,
                     stage_num);
    errcode = SUNDataNode_GetChild(step_data_node, stage_num, &solution_node);
    if (errcode == SUN_ERR_DATANODE_NODENOTFOUND) { solution_node = NULL; }
    else { SUNCheckCall(errcode); }
  }
  else
  {
    sunbooleantype has_children = SUNFALSE;
    SUNCheckCall(SUNDataNode_HasChildren(step_data_node, &has_children));

    if (has_children)
    {
      SUNLogExtraDebug(SUNCTX_->logger, "try-load-stage",
                       "keep = 0, step_num = %d, stage_num = %d", step_num,
                       stage_num);
      errcode = SUNDataNode_RemoveChild(step_data_node, stage_num,
                                        &solution_node);
      if (errcode == SUN_ERR_DATANODE_NODENOTFOUND) { solution_node = NULL; }
      else { SUNCheckCall(errcode); }
    }

    /* If we just removed the last stage (so has_children==false),
       then we should remove the step too. */
    SUNCheckCall(SUNDataNode_HasChildren(step_data_node, &has_children));
    if (!has_children)
    {
      char* key = sunSignedToString(step_num);
      SUNLogExtraDebug(SUNCTX_->logger, "remove-step", "step_num = %d", step_num);
      SUNCheckCall(SUNDataNode_RemoveNamedChild(IMPL_MEMBER(self, root_node),
                                                key, &step_data_node));
      free(key);
      SUNCheckCall(SUNDataNode_Destroy(&step_data_node));
    }
  }

  if (!solution_node)
  {
    SUNLogExtraDebug(SUNCTX_->logger, "stage-not-found",
                     "step_num = %d, stage_num = %d", step_num, stage_num);
    return SUN_ERR_CHECKPOINT_NOT_FOUND;
  }

  SUNCheckCall(SUNDataNode_GetDataNvector(solution_node, *yout, tout));
  SUNLogExtraDebug(SUNCTX_->logger, "stage-loaded",
                   "step_num = %d, stage_num = %d, t = %g", step_num, stage_num,
                   *tout);

  /* Cleanup the checkpoint memory if need be */
  if (!(IMPL_MEMBER(self, keep) || peek))
  {
    SUNCheckCall(SUNDataNode_Destroy(&solution_node));
  }

  return SUN_SUCCESS;
}